

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

int nk_do_selectable(nk_flags *state,nk_command_buffer *out,nk_rect bounds,char *str,int len,
                    nk_flags align,int *value,nk_style_selectable *style,nk_input *in,
                    nk_user_font *font)

{
  float fVar1;
  float fVar2;
  int iVar3;
  nk_rect r;
  int iVar4;
  undefined8 uVar5;
  nk_rect touch;
  int old_value;
  int *value_local;
  nk_flags align_local;
  int len_local;
  char *str_local;
  nk_command_buffer *out_local;
  nk_flags *state_local;
  float fStack_28;
  nk_rect bounds_local;
  
  uVar5 = bounds._8_8_;
  register0x00001200 = bounds._0_8_;
  bounds_local._0_8_ = uVar5;
  if (state == (nk_flags *)0x0) {
    __assert_fail("state",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/deps/nuklear.h"
                  ,0x501e,
                  "int nk_do_selectable(nk_flags *, struct nk_command_buffer *, struct nk_rect, const char *, int, nk_flags, int *, const struct nk_style_selectable *, const struct nk_input *, const struct nk_user_font *)"
                 );
  }
  if (out == (nk_command_buffer *)0x0) {
    __assert_fail("out",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/deps/nuklear.h"
                  ,0x501f,
                  "int nk_do_selectable(nk_flags *, struct nk_command_buffer *, struct nk_rect, const char *, int, nk_flags, int *, const struct nk_style_selectable *, const struct nk_input *, const struct nk_user_font *)"
                 );
  }
  if (str == (char *)0x0) {
    __assert_fail("str",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/deps/nuklear.h"
                  ,0x5020,
                  "int nk_do_selectable(nk_flags *, struct nk_command_buffer *, struct nk_rect, const char *, int, nk_flags, int *, const struct nk_style_selectable *, const struct nk_input *, const struct nk_user_font *)"
                 );
  }
  if (len != 0) {
    if (value == (int *)0x0) {
      __assert_fail("value",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/deps/nuklear.h"
                    ,0x5022,
                    "int nk_do_selectable(nk_flags *, struct nk_command_buffer *, struct nk_rect, const char *, int, nk_flags, int *, const struct nk_style_selectable *, const struct nk_input *, const struct nk_user_font *)"
                   );
    }
    if (style != (nk_style_selectable *)0x0) {
      if (font != (nk_user_font *)0x0) {
        if ((((state == (nk_flags *)0x0) || (out == (nk_command_buffer *)0x0)) ||
            (str == (char *)0x0)) ||
           (((len == 0 || (value == (int *)0x0)) ||
            ((style == (nk_style_selectable *)0x0 || (font == (nk_user_font *)0x0)))))) {
          bounds_local.w = 0.0;
        }
        else {
          iVar3 = *value;
          state_local._4_4_ = bounds.x;
          fStack_28 = bounds.y;
          bounds_local.x = bounds.w;
          fVar1 = (style->touch_padding).x;
          bounds_local.y = bounds.h;
          fVar2 = (style->touch_padding).y;
          r.y = fStack_28 - (style->touch_padding).y;
          r.x = state_local._4_4_ - (style->touch_padding).x;
          r.w = fVar1 + fVar1 + bounds_local.x;
          r.h = fVar2 + fVar2 + bounds_local.y;
          iVar4 = nk_button_behavior(state,r,in,NK_BUTTON_DEFAULT);
          if (iVar4 != 0) {
            *value = (uint)((*value != 0 ^ 0xffU) & 1);
          }
          if (style->draw_begin != (_func_void_nk_command_buffer_ptr_nk_handle *)0x0) {
            (*style->draw_begin)(out,(nk_handle)(style->userdata).ptr);
          }
          nk_draw_selectable(out,*state,style,*value,(nk_rect *)((long)&state_local + 4),
                             (nk_rect *)0x0,(nk_image *)0x0,NK_SYMBOL_NONE,str,len,align,font);
          if (style->draw_end != (_func_void_nk_command_buffer_ptr_nk_handle *)0x0) {
            (*style->draw_end)(out,(nk_handle)(style->userdata).ptr);
          }
          bounds_local.w = (float)(uint)(iVar3 != *value);
        }
        return (int)bounds_local.w;
      }
      __assert_fail("font",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/deps/nuklear.h"
                    ,0x5024,
                    "int nk_do_selectable(nk_flags *, struct nk_command_buffer *, struct nk_rect, const char *, int, nk_flags, int *, const struct nk_style_selectable *, const struct nk_input *, const struct nk_user_font *)"
                   );
    }
    __assert_fail("style",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/deps/nuklear.h"
                  ,0x5023,
                  "int nk_do_selectable(nk_flags *, struct nk_command_buffer *, struct nk_rect, const char *, int, nk_flags, int *, const struct nk_style_selectable *, const struct nk_input *, const struct nk_user_font *)"
                 );
  }
  __assert_fail("len",
                "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/deps/nuklear.h"
                ,0x5021,
                "int nk_do_selectable(nk_flags *, struct nk_command_buffer *, struct nk_rect, const char *, int, nk_flags, int *, const struct nk_style_selectable *, const struct nk_input *, const struct nk_user_font *)"
               );
}

Assistant:

NK_LIB int
nk_do_selectable(nk_flags *state, struct nk_command_buffer *out,
    struct nk_rect bounds, const char *str, int len, nk_flags align, int *value,
    const struct nk_style_selectable *style, const struct nk_input *in,
    const struct nk_user_font *font)
{
    int old_value;
    struct nk_rect touch;

    NK_ASSERT(state);
    NK_ASSERT(out);
    NK_ASSERT(str);
    NK_ASSERT(len);
    NK_ASSERT(value);
    NK_ASSERT(style);
    NK_ASSERT(font);

    if (!state || !out || !str || !len || !value || !style || !font) return 0;
    old_value = *value;

    /* remove padding */
    touch.x = bounds.x - style->touch_padding.x;
    touch.y = bounds.y - style->touch_padding.y;
    touch.w = bounds.w + style->touch_padding.x * 2;
    touch.h = bounds.h + style->touch_padding.y * 2;

    /* update button */
    if (nk_button_behavior(state, touch, in, NK_BUTTON_DEFAULT))
        *value = !(*value);

    /* draw selectable */
    if (style->draw_begin) style->draw_begin(out, style->userdata);
    nk_draw_selectable(out, *state, style, *value, &bounds, 0,0,NK_SYMBOL_NONE, str, len, align, font);
    if (style->draw_end) style->draw_end(out, style->userdata);
    return old_value != *value;
}